

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O2

int Abc_NtkRewrite(Abc_Ntk_t *pNtk,int fUpdateLevel,int fUseZeros,int fVerbose,int fVeryVerbose,
                  int fPlaceEnable)

{
  int nGain;
  int iVar1;
  abctime aVar2;
  Rwr_Man_t *p;
  abctime aVar3;
  Cut_Man_t *p_00;
  Vec_Int_t *vFanCounts;
  void *pvVar4;
  abctime aVar5;
  ProgressBar *p_01;
  Abc_Obj_t *pNode;
  Dec_Graph_t *pGraph;
  int iVar6;
  char *__assertion;
  int iVar7;
  
  aVar2 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                  ,0x49,"int Abc_NtkRewrite(Abc_Ntk_t *, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  iVar6 = 0;
  p = Rwr_ManStart(0);
  if (p != (Rwr_Man_t *)0x0) {
    if (fUpdateLevel != 0) {
      Abc_NtkStartReverseLevels(pNtk,0);
    }
    aVar3 = Abc_Clock();
    Abc_NtkStartCutManForRewrite_Params._32_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._40_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._48_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._56_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._64_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._72_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._0_8_ = 0xfa00000004;
    Abc_NtkStartCutManForRewrite_Params._16_8_ = 0x100000000;
    Abc_NtkStartCutManForRewrite_Params._24_8_ = 1;
    Abc_NtkStartCutManForRewrite_Params._12_4_ = 0;
    Abc_NtkStartCutManForRewrite_Params._8_4_ = pNtk->vObjs->nSize;
    p_00 = Cut_ManStart((Cut_Params_t *)Abc_NtkStartCutManForRewrite_Params);
    if (Abc_NtkStartCutManForRewrite_Params._32_4_ != 0) {
      vFanCounts = Abc_NtkFanoutCounts(pNtk);
      Cut_ManSetFanoutCounts(p_00,vFanCounts);
    }
    for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pvVar4 = Vec_PtrEntry(pNtk->vCis,iVar6);
      if (0 < *(int *)((long)pvVar4 + 0x2c)) {
        Cut_NodeSetTriv(p_00,*(int *)((long)pvVar4 + 0x10));
      }
    }
    aVar5 = Abc_Clock();
    Rwr_ManAddTimeCuts(p,aVar5 - aVar3);
    pNtk->pManCut = p_00;
    if (fVeryVerbose != 0) {
      Rwr_ScoresClean(p);
    }
    p->nNodesBeg = pNtk->nObjCounts[7];
    iVar6 = pNtk->vObjs->nSize;
    p_01 = Extra_ProgressBarStart(_stdout,iVar6);
    for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
      pNode = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar7);
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar7)) {
          Extra_ProgressBarUpdate_int(p_01,iVar7,(char *)0x0);
        }
        if (iVar6 <= iVar7) break;
        if (((ulong)pNode & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0026cd0f:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0026cd0f;
        }
        if ((pNode->vFanins).nSize != 2) {
          __assert_fail("Abc_AigNodeIsAnd(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x192,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
        }
        if (((pNode->field_0x15 & 2) == 0) && ((pNode->vFanouts).nSize < 0x3e9)) {
          nGain = Rwr_NodeRewrite(p,p_00,pNode,fUpdateLevel,fUseZeros,fPlaceEnable);
          if ((0 < nGain) || (fUseZeros != 0 && nGain == 0)) {
            pGraph = (Dec_Graph_t *)Rwr_ManReadDecs(p);
            iVar1 = Rwr_ManReadCompl(p);
            if (fPlaceEnable != 0) {
              Abc_AigUpdateReset((Abc_Aig_t *)pNtk->pManFunc);
            }
            if (iVar1 == 0) {
              aVar3 = Abc_Clock();
              Dec_GraphUpdateNetwork(pNode,pGraph,fUpdateLevel,nGain);
              aVar5 = Abc_Clock();
              Rwr_ManAddTimeUpdate(p,aVar5 - aVar3);
            }
            else {
              *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
              aVar3 = Abc_Clock();
              Dec_GraphUpdateNetwork(pNode,pGraph,fUpdateLevel,nGain);
              aVar5 = Abc_Clock();
              Rwr_ManAddTimeUpdate(p,aVar5 - aVar3);
              *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
            }
          }
        }
      }
    }
    Extra_ProgressBarStop(p_01);
    aVar3 = Abc_Clock();
    Rwr_ManAddTimeTotal(p,aVar3 - aVar2);
    p->nNodesEnd = pNtk->nObjCounts[7];
    if (fVerbose != 0) {
      Rwr_ManPrintStats(p);
    }
    iVar6 = 1;
    if (fVeryVerbose != 0) {
      Rwr_ScoresReport(p);
    }
    Rwr_ManStop(p);
    Cut_ManStop(p_00);
    pNtk->pManCut = (void *)0x0;
    Abc_NtkReassignIds(pNtk);
    if (fUpdateLevel == 0) {
      Abc_NtkLevel(pNtk);
    }
    else {
      Abc_NtkStopReverseLevels(pNtk);
    }
    iVar7 = Abc_NtkCheck(pNtk);
    if (iVar7 == 0) {
      puts("Abc_NtkRewrite: The network check has failed.");
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Abc_NtkRewrite( Abc_Ntk_t * pNtk, int fUpdateLevel, int fUseZeros, int fVerbose, int fVeryVerbose, int fPlaceEnable )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Cut_Man_t * pManCut;
    Rwr_Man_t * pManRwr;
    Abc_Obj_t * pNode;
//    Vec_Ptr_t * vAddedCells = NULL, * vUpdatedNets = NULL;
    Dec_Graph_t * pGraph;
    int i, nNodes, nGain, fCompl;
    abctime clk, clkStart = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
/*
    {
        Vec_Vec_t * vParts;
        vParts = Abc_NtkPartitionSmart( pNtk, 50, 1 );
        Vec_VecFree( vParts );
    }
*/

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceBegin( pNtk );
//        vAddedCells = Abc_AigUpdateStart( pNtk->pManFunc, &vUpdatedNets );
//    }

    // start the rewriting manager
    pManRwr = Rwr_ManStart( 0 );
    if ( pManRwr == NULL )
        return 0;
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );
    // start the cut manager
clk = Abc_Clock();
    pManCut = Abc_NtkStartCutManForRewrite( pNtk );
Rwr_ManAddTimeCuts( pManRwr, Abc_Clock() - clk );
    pNtk->pManCut = pManCut;

    if ( fVeryVerbose )
        Rwr_ScoresClean( pManRwr );

    // resynthesize each node once
    pManRwr->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;

        // for each cut, try to resynthesize it
        nGain = Rwr_NodeRewrite( pManRwr, pManCut, pNode, fUpdateLevel, fUseZeros, fPlaceEnable );
        if ( !(nGain > 0 || (nGain == 0 && fUseZeros)) )
            continue;
        // if we end up here, a rewriting step is accepted

        // get hold of the new subgraph to be added to the AIG
        pGraph = (Dec_Graph_t *)Rwr_ManReadDecs(pManRwr);
        fCompl = Rwr_ManReadCompl(pManRwr);

        // reset the array of the changed nodes
        if ( fPlaceEnable )
            Abc_AigUpdateReset( (Abc_Aig_t *)pNtk->pManFunc );

        // complement the FF if needed
        if ( fCompl ) Dec_GraphComplement( pGraph );
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pGraph, fUpdateLevel, nGain );
Rwr_ManAddTimeUpdate( pManRwr, Abc_Clock() - clk );
        if ( fCompl ) Dec_GraphComplement( pGraph );

        // use the array of changed nodes to update placement
//        if ( fPlaceEnable )
//            Abc_PlaceUpdate( vAddedCells, vUpdatedNets );
    }
    Extra_ProgressBarStop( pProgress );
Rwr_ManAddTimeTotal( pManRwr, Abc_Clock() - clkStart );
    // print stats
    pManRwr->nNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( fVerbose )
        Rwr_ManPrintStats( pManRwr );
//        Rwr_ManPrintStatsFile( pManRwr );
    if ( fVeryVerbose )
        Rwr_ScoresReport( pManRwr );
    // delete the managers
    Rwr_ManStop( pManRwr );
    Cut_ManStop( pManCut );
    pNtk->pManCut = NULL;

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceEnd( pNtk );
//        Abc_AigUpdateStop( pNtk->pManFunc );
//    }

    // put the nodes into the DFS order and reassign their IDs
    {
//        abctime clk = Abc_Clock();
    Abc_NtkReassignIds( pNtk );
//        ABC_PRT( "time", Abc_Clock() - clk );
    }
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}